

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O2

bool bssl::ssl_parse_cert_chain
               (uint8_t *out_alert,UniquePtr<struct_stack_st_CRYPTO_BUFFER> *out_chain,
               UniquePtr<EVP_PKEY> *out_pubkey,uint8_t *out_leaf_sha256,CBS *cbs,
               CRYPTO_BUFFER_POOL *pool)

{
  UniquePtr<CRYPTO_BUFFER> __p;
  UniquePtr<EVP_PKEY> __p_00;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> __p_01;
  enable_if_t<_internal::StackTraits<stack_st_CRYPTO_BUFFER>::kIsConst,_bool> eVar1;
  int iVar2;
  size_t sVar3;
  _Head_base<0UL,_crypto_buffer_st_*,_false> _Var4;
  bool bVar5;
  UniquePtr<CRYPTO_BUFFER> buf;
  UniquePtr<EVP_PKEY> pubkey;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> chain;
  unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> local_68;
  __uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *local_60;
  __uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *local_58;
  CBS certificate;
  CBS certificate_list;
  
  local_60 = (__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)out_chain;
  std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)out_chain,
             (pointer)0x0);
  local_58 = (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)out_pubkey;
  std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)out_pubkey,(pointer)0x0);
  iVar2 = CBS_get_u24_length_prefixed(cbs,&certificate_list);
  if (iVar2 == 0) {
    *out_alert = '2';
    bVar5 = false;
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                  ,0x85);
  }
  else if (certificate_list.len == 0) {
    bVar5 = true;
  }
  else {
    chain._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
         (__uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true>)
         OPENSSL_sk_new_null();
    if ((tuple<stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>)
        chain._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl ==
        (_Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>)0x0) {
      *out_alert = 'P';
      bVar5 = false;
    }
    else {
      pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
      while (__p_01._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t
             .super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
                  chain._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl,
            bVar5 = certificate_list.len == 0, !bVar5) {
        iVar2 = CBS_get_u24_length_prefixed(&certificate_list,&certificate);
        if ((iVar2 == 0) || (certificate.len == 0)) {
          *out_alert = '2';
          ERR_put_error(0x10,0,0x7f,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                        ,0x99);
          goto LAB_0014a0b4;
        }
        sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)
                               chain._M_t.
                               super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                               .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl)
        ;
        if (sVar3 == 0) {
          ssl_cert_parse_pubkey((bssl *)&buf,&certificate);
          __p = buf;
          buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0;
          std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)&pubkey,
                     (pointer)__p._M_t.
                              super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl);
          std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&buf);
          if ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)
              pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl ==
              (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0) {
            *out_alert = '2';
            goto LAB_0014a0b4;
          }
          if (out_leaf_sha256 != (uint8_t *)0x0) {
            SHA256(certificate.data,certificate.len,out_leaf_sha256);
          }
        }
        _Var4._M_head_impl = CRYPTO_BUFFER_new_from_CBS(&certificate,pool);
        buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             _Var4._M_head_impl;
        if ((tuple<crypto_buffer_st_*,_bssl::internal::Deleter>)_Var4._M_head_impl ==
            (_Head_base<0UL,_crypto_buffer_st_*,_false>)0x0) {
LAB_0014a048:
          *out_alert = 'P';
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&buf);
          goto LAB_0014a0b4;
        }
        buf._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>)0x0;
        local_68._M_t.super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl =
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_data<crypto_buffer_st,_bssl::internal::Deleter,_true,_true>)
             _Var4._M_head_impl;
        eVar1 = PushToStack<stack_st_CRYPTO_BUFFER>
                          ((stack_st_CRYPTO_BUFFER *)
                           chain._M_t.
                           super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>.
                           _M_t.
                           super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                           .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl,
                           &local_68);
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr(&local_68);
        if (!eVar1) goto LAB_0014a048;
        std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&buf);
      }
      chain._M_t.super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl =
           (__uniq_ptr_data<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>)0x0;
      std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                (local_60,(pointer)__p_01._M_t.
                                   super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>
                                   .super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>.
                                   _M_head_impl);
      __p_00 = pubkey;
      pubkey._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
      std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
                (local_58,(pointer)__p_00._M_t.
                                   super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                                   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl);
LAB_0014a0b4:
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&pubkey);
    }
    std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr(&chain);
  }
  return bVar5;
}

Assistant:

bool ssl_parse_cert_chain(uint8_t *out_alert,
                          UniquePtr<STACK_OF(CRYPTO_BUFFER)> *out_chain,
                          UniquePtr<EVP_PKEY> *out_pubkey,
                          uint8_t *out_leaf_sha256, CBS *cbs,
                          CRYPTO_BUFFER_POOL *pool) {
  out_chain->reset();
  out_pubkey->reset();

  CBS certificate_list;
  if (!CBS_get_u24_length_prefixed(cbs, &certificate_list)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  if (CBS_len(&certificate_list) == 0) {
    return true;
  }

  UniquePtr<STACK_OF(CRYPTO_BUFFER)> chain(sk_CRYPTO_BUFFER_new_null());
  if (!chain) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  UniquePtr<EVP_PKEY> pubkey;
  while (CBS_len(&certificate_list) > 0) {
    CBS certificate;
    if (!CBS_get_u24_length_prefixed(&certificate_list, &certificate) ||
        CBS_len(&certificate) == 0) {
      *out_alert = SSL_AD_DECODE_ERROR;
      OPENSSL_PUT_ERROR(SSL, SSL_R_CERT_LENGTH_MISMATCH);
      return false;
    }

    if (sk_CRYPTO_BUFFER_num(chain.get()) == 0) {
      pubkey = ssl_cert_parse_pubkey(&certificate);
      if (!pubkey) {
        *out_alert = SSL_AD_DECODE_ERROR;
        return false;
      }

      // Retain the hash of the leaf certificate if requested.
      if (out_leaf_sha256 != NULL) {
        SHA256(CBS_data(&certificate), CBS_len(&certificate), out_leaf_sha256);
      }
    }

    UniquePtr<CRYPTO_BUFFER> buf(
        CRYPTO_BUFFER_new_from_CBS(&certificate, pool));
    if (!buf ||  //
        !PushToStack(chain.get(), std::move(buf))) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return false;
    }
  }

  *out_chain = std::move(chain);
  *out_pubkey = std::move(pubkey);
  return true;
}